

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpServer.cpp
# Opt level: O1

void __thiscall
Liby::http::HttpServer::HttpServer
          (HttpServer *this,string *root,shared_ptr<Liby::TcpServer> *server)

{
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  (this->root_)._M_dataplus._M_p = (pointer)&(this->root_).field_2;
  pcVar1 = (root->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + root->_M_string_length);
  (this->http_server_).super___shared_ptr<Liby::TcpServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (server->super___shared_ptr<Liby::TcpServer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (server->super___shared_ptr<Liby::TcpServer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (this->http_server_).super___shared_ptr<Liby::TcpServer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  local_38._8_8_ = 0;
  pcStack_20 = std::
               _Function_handler<void_(Liby::Connection_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/http/HttpServer.cpp:17:26)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(Liby::Connection_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/http/HttpServer.cpp:17:26)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  std::function<void_(Liby::Connection_&)>::operator=
            (&((this->http_server_).super___shared_ptr<Liby::TcpServer,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->readEventCallback_,(function<void_(Liby::Connection_&)> *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  local_38._8_8_ = 0;
  pcStack_20 = std::
               _Function_handler<void_(Liby::Connection_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/http/HttpServer.cpp:19:9)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(Liby::Connection_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/http/HttpServer.cpp:19:9)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  std::function<void_(Liby::Connection_&)>::operator=
            (&((this->http_server_).super___shared_ptr<Liby::TcpServer,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->acceptorCallback_,(function<void_(Liby::Connection_&)> *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  local_38._8_8_ = 0;
  pcStack_20 = std::
               _Function_handler<void_(Liby::Connection_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/http/HttpServer.cpp:20:26)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(Liby::Connection_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/http/HttpServer.cpp:20:26)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  std::function<void_(Liby::Connection_&)>::operator=
            (&((this->http_server_).super___shared_ptr<Liby::TcpServer,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->erroEventCallback_,(function<void_(Liby::Connection_&)> *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  TcpServer::start((this->http_server_).
                   super___shared_ptr<Liby::TcpServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  return;
}

Assistant:

HttpServer::HttpServer(const std::string &root,
                       const std::shared_ptr<TcpServer> &server)
    : root_(root), http_server_(server) {
    http_server_->onRead([this](Connection &conn) { handleReadEvent(conn); });
    http_server_->onAccept(
        [this](Connection &conn) { handleAcceptEvent(conn); });
    http_server_->onErro([this](Connection &conn) { handleErroEvent(conn); });
    http_server_->start();
}